

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

int flatcc_builder_init(flatcc_builder_t *B)

{
  int iVar1;
  flatcc_builder_t *B_local;
  
  iVar1 = flatcc_builder_custom_init
                    (B,(flatcc_builder_emit_fun *)0x0,(void *)0x0,(flatcc_builder_alloc_fun *)0x0,
                     (void *)0x0);
  return iVar1;
}

Assistant:

int flatcc_builder_init(flatcc_builder_t *B)
{
    return flatcc_builder_custom_init(B, 0, 0, 0, 0);
}